

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

_Bool upb_inttable_compact(upb_inttable *t,upb_Arena *a)

{
  long lVar1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  size_t v;
  uintptr_t uVar6;
  long lVar7;
  uint uVar8;
  upb_value val;
  uintptr_t key;
  ulong local_140;
  upb_value val_1;
  upb_inttable new_t;
  uint32_t counts [17];
  uintptr_t max [17];
  
  counts[0xc] = 0;
  counts[0xd] = 0;
  counts[0xe] = 0;
  counts[0xf] = 0;
  counts[8] = 0;
  counts[9] = 0;
  counts[10] = 0;
  counts[0xb] = 0;
  counts[4] = 0;
  counts[5] = 0;
  counts[6] = 0;
  counts[7] = 0;
  counts[0] = 0;
  counts[1] = 0;
  counts[2] = 0;
  counts[3] = 0;
  counts[0x10] = 0;
  memset(max,0,0x88);
  new_t.t.entries = (upb_tabent *)0xffffffffffffffff;
  while (_Var2 = upb_inttable_next(t,&key,&val,(intptr_t *)&new_t), uVar6 = key, _Var2) {
    iVar4 = log2ceil(key);
    if (uVar6 < max[iVar4]) {
      uVar6 = max[iVar4];
    }
    max[iVar4] = uVar6;
    counts[iVar4] = counts[iVar4] + 1;
  }
  uVar8 = t->array_count + (t->t).count;
  lVar1 = 0x10;
  uVar5 = uVar8;
  while (lVar7 = lVar1, lVar7 != 0) {
    lVar1 = lVar7 + -1;
    if (counts[lVar7] != 0) {
      if ((double)(1 << ((byte)lVar7 & 0x1f)) * 0.1 <= (double)uVar5) break;
      uVar5 = uVar5 - counts[lVar7];
    }
  }
  if (uVar8 < uVar5) {
    __assert_fail("arr_count <= upb_inttable_count(t)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                  ,0x335,"_Bool upb_inttable_compact(upb_inttable *, upb_Arena *)");
  }
  uVar6 = max[lVar7];
  if (uVar8 - uVar5 == 0) {
    v = 0;
  }
  else {
    v = _upb_entries_needed_for((ulong)(uVar8 - uVar5));
  }
  iVar4 = log2ceil(v);
  _Var2 = upb_inttable_sizedinit(&new_t,(uint32_t)(uVar6 + 1),iVar4,a);
  if (_Var2) {
    key = 0xffffffffffffffff;
    local_140 = uVar6 + 1;
    while (_Var3 = upb_inttable_next(t,&val.val,&val_1,(intptr_t *)&key), _Var3) {
      upb_inttable_insert(&new_t,val.val,val_1,a);
    }
    if (local_140 != new_t.array_size) {
      __assert_fail("new_t.array_size == arr_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/hash/common.c"
                    ,0x34c,"_Bool upb_inttable_compact(upb_inttable *, upb_Arena *)");
    }
    t->array_size = new_t.array_size;
    t->array_count = new_t.array_count;
    t->array = new_t.array;
    t->presence_mask = new_t.presence_mask;
    (t->t).entries = new_t.t.entries;
    (t->t).count = new_t.t.count;
    (t->t).mask = new_t.t.mask;
  }
  return _Var2;
}

Assistant:

bool upb_inttable_compact(upb_inttable* t, upb_Arena* a) {
  /* A power-of-two histogram of the table keys. */
  uint32_t counts[UPB_MAXARRSIZE + 1] = {0};

  /* The max key in each bucket. */
  uintptr_t max[UPB_MAXARRSIZE + 1] = {0};

  {
    intptr_t iter = UPB_INTTABLE_BEGIN;
    uintptr_t key;
    upb_value val;
    while (upb_inttable_next(t, &key, &val, &iter)) {
      int bucket = log2ceil(key);
      max[bucket] = UPB_MAX(max[bucket], key);
      counts[bucket]++;
    }
  }

  /* Find the largest power of two that satisfies the MIN_DENSITY
   * definition (while actually having some keys). */
  uint32_t arr_count = upb_inttable_count(t);

  // Scan all buckets except capped bucket
  int size_lg2 = ARRAY_SIZE(counts) - 1;
  for (; size_lg2 > 0; size_lg2--) {
    if (counts[size_lg2] == 0) {
      /* We can halve again without losing any entries. */
      continue;
    } else if (arr_count >= (1 << size_lg2) * MIN_DENSITY) {
      break;
    }

    arr_count -= counts[size_lg2];
  }

  UPB_ASSERT(arr_count <= upb_inttable_count(t));

  upb_inttable new_t;
  {
    /* Insert all elements into new, perfectly-sized table. */
    uintptr_t arr_size = max[size_lg2] + 1; /* +1 so arr[max] will fit. */
    uint32_t hash_count = upb_inttable_count(t) - arr_count;
    size_t hash_size = hash_count ? _upb_entries_needed_for(hash_count) : 0;
    int hashsize_lg2 = log2ceil(hash_size);

    if (!upb_inttable_sizedinit(&new_t, arr_size, hashsize_lg2, a)) {
      return false;
    }

    {
      intptr_t iter = UPB_INTTABLE_BEGIN;
      uintptr_t key;
      upb_value val;
      while (upb_inttable_next(t, &key, &val, &iter)) {
        upb_inttable_insert(&new_t, key, val, a);
      }
    }

    UPB_ASSERT(new_t.array_size == arr_size);
  }
  *t = new_t;
  return true;
}